

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_interface.c
# Opt level: O2

int fe_copy_from_prespch(fe_t *fe,int32 *inout_nframes,mfcc_t **buf_cep,int outidx)

{
  int iVar1;
  mfcc_t **ppmVar2;
  
  iVar1 = *inout_nframes;
  ppmVar2 = buf_cep + outidx;
  while( true ) {
    if (iVar1 < 1) {
      return outidx;
    }
    iVar1 = fe_prespch_read_cep(fe->vad_data->prespch_buf,*ppmVar2);
    if (iVar1 < 1) break;
    iVar1 = *inout_nframes + -1;
    *inout_nframes = iVar1;
    outidx = outidx + 1;
    ppmVar2 = ppmVar2 + 1;
  }
  return outidx;
}

Assistant:

static int
fe_copy_from_prespch(fe_t *fe, int32 *inout_nframes, mfcc_t **buf_cep, int outidx)
{
    while ((*inout_nframes) > 0 && fe_prespch_read_cep(fe->vad_data->prespch_buf, buf_cep[outidx]) > 0) {
	    outidx++;
    	    (*inout_nframes)--;
    }
    return outidx;    
}